

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  char cVar4;
  char *pcVar5;
  size_t i;
  ulong uVar6;
  
  uVar6 = 0;
  do {
    if ((this->m_str)._M_string_length <= uVar6) {
      return;
    }
    pcVar1 = (this->m_str)._M_dataplus._M_p;
    cVar4 = pcVar1[uVar6];
    poVar3 = os;
    if (cVar4 == '\"') {
      if (this->m_forWhat != ForAttributes) {
        cVar4 = '\"';
        goto LAB_00150a87;
      }
      pcVar5 = "&quot;";
LAB_001509f9:
      std::operator<<(os,pcVar5);
    }
    else {
      if (cVar4 == '&') {
        pcVar5 = "&amp;";
        goto LAB_001509f9;
      }
      if (cVar4 == '>') {
        if (((2 < uVar6) && (pcVar1[uVar6 - 1] == ']')) && (pcVar1[uVar6 - 2] == ']')) {
          pcVar5 = "&gt;";
          goto LAB_001509f9;
        }
        cVar4 = '>';
      }
      else {
        if (cVar4 == '<') {
          pcVar5 = "&lt;";
          goto LAB_001509f9;
        }
        if ((cVar4 < '\t') || (cVar4 == '\x7f' || (byte)(cVar4 - 0xeU) < 0x12)) {
          poVar3 = std::operator<<(os,"&#x");
          lVar2 = *(long *)poVar3;
          *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) =
               *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
          lVar2 = *(long *)(lVar2 + -0x18);
          *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
          poVar3 = std::operator<<(poVar3,0x30);
          *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)cVar4);
          cVar4 = ';';
        }
      }
LAB_00150a87:
      std::operator<<(poVar3,cVar4);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465 and
                        // by @mrpi PR #588
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << std::setfill('0') << std::setw(2) << static_cast<int>( c ) << ';';
                        else
                            os << c;
                }
            }
        }